

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Node::Node(Node *this,string *name,string *label,string *shape)

{
  size_type sVar1;
  size_type sVar2;
  allocator<char> local_41;
  string *local_40;
  string *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  local_38 = &this->label;
  std::__cxx11::string::string((string *)&this->shape,(string *)shape);
  local_40 = &this->shape;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->extra,"",&local_41);
  std::__cxx11::string::assign((char *)this);
  sVar1 = name->_M_string_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)this);
  }
  return;
}

Assistant:

Node::Node(const string &name, const string &label, const string &shape) : name(name), label(label), shape(shape),
                                                                           extra("") {
    this->name = "";
    for (char c: name) {
        if (c == '#')
            c = '_';
        this->name += c;
    }
}